

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# studentGrades.cpp
# Opt level: O2

void printStudentSummary(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         *studentScores,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *studentNames)

{
  char cVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  assignmentScores;
  _Vector_base<double,_std::allocator<double>_> local_108;
  _Vector_base<double,_std::allocator<double>_> local_f0;
  _Vector_base<double,_std::allocator<double>_> local_d8;
  _Vector_base<double,_std::allocator<double>_> local_c0;
  _Vector_base<double,_std::allocator<double>_> local_a8;
  _Vector_base<double,_std::allocator<double>_> local_90;
  _Vector_base<double,_std::allocator<double>_> local_78;
  _Vector_base<double,_std::allocator<double>_> local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_48,studentScores);
  transpose(&assignmentScores,&local_48);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  lVar4 = 0;
  lVar3 = 0;
  for (uVar5 = 0;
      uVar5 < (ulong)(((long)(studentScores->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(studentScores->
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar5 = uVar5 + 1)
  {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             (string *)
                             ((long)&(((studentNames->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                     _M_p + lVar3));
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cout,"Highest score = ");
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_a8,
               (vector<double,_std::allocator<double>_> *)
               ((long)&(((studentScores->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar4));
    dVar6 = max((vector<double,_std::allocator<double>_> *)&local_a8);
    poVar2 = std::ostream::_M_insert<double>(dVar6);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a8);
    std::operator<<((ostream *)&std::cout,"Lowest score = ");
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_c0,
               (vector<double,_std::allocator<double>_> *)
               ((long)&(((studentScores->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar4));
    dVar6 = min((vector<double,_std::allocator<double>_> *)&local_c0);
    poVar2 = std::ostream::_M_insert<double>(dVar6);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_c0);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_60,
               (vector<double,_std::allocator<double>_> *)
               ((long)&(((studentScores->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar4));
    dVar6 = mean((vector<double,_std::allocator<double>_> *)&local_60);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
    std::operator<<((ostream *)&std::cout,"Mean = ");
    poVar2 = std::ostream::_M_insert<double>(dVar6);
    poVar2 = std::operator<<(poVar2," Grade:");
    cVar1 = gradeLetter(dVar6);
    poVar2 = std::operator<<(poVar2,cVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cout,"Mean (lowest dropped) = ");
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_d8,
               (vector<double,_std::allocator<double>_> *)
               ((long)&(((studentScores->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar4));
    dVar6 = meanLowestDropped((vector<double,_std::allocator<double>_> *)&local_d8);
    poVar2 = std::ostream::_M_insert<double>(dVar6);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_d8);
    poVar2 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar2);
    lVar3 = lVar3 + 0x20;
    lVar4 = lVar4 + 0x18;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar2 = std::operator<<((ostream *)&std::cout,"++++++++++++++++++++++++++++++++++++++++++++");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  lVar3 = 0;
  for (uVar5 = 0;
      uVar5 < (ulong)(((long)assignmentScores.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)assignmentScores.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar5 = uVar5 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Assignment: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)uVar5 + 1);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cout,"Highest score = ");
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_f0,
               (vector<double,_std::allocator<double>_> *)
               ((long)&((assignmentScores.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar3));
    dVar6 = max((vector<double,_std::allocator<double>_> *)&local_f0);
    poVar2 = std::ostream::_M_insert<double>(dVar6);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_f0);
    std::operator<<((ostream *)&std::cout,"Lowest score = ");
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_108,
               (vector<double,_std::allocator<double>_> *)
               ((long)&((assignmentScores.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar3));
    dVar6 = min((vector<double,_std::allocator<double>_> *)&local_108);
    poVar2 = std::ostream::_M_insert<double>(dVar6);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_108);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_78,
               (vector<double,_std::allocator<double>_> *)
               ((long)&((assignmentScores.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar3));
    dVar6 = mean((vector<double,_std::allocator<double>_> *)&local_78);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_78);
    std::operator<<((ostream *)&std::cout,"Mean = ");
    poVar2 = std::ostream::_M_insert<double>(dVar6);
    poVar2 = std::operator<<(poVar2," Grade:");
    cVar1 = gradeLetter(dVar6);
    poVar2 = std::operator<<(poVar2,cVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cout,"Mean (lowest dropped) = ");
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_90,
               (vector<double,_std::allocator<double>_> *)
               ((long)&((assignmentScores.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar3));
    dVar6 = meanLowestDropped((vector<double,_std::allocator<double>_> *)&local_90);
    poVar2 = std::ostream::_M_insert<double>(dVar6);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_90);
    poVar2 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
    lVar3 = lVar3 + 0x18;
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&assignmentScores);
  return;
}

Assistant:

void printStudentSummary(vector<vector<double>> studentScores, vector<string> studentNames) {
    vector<vector<double>> assignmentScores = transpose(studentScores);

    // PRINT STUDENT RESULTS
    for (int i = 0; i < studentScores.size(); i++) {
        cout << studentNames[i] << endl;
        cout << "Highest score = " << max(studentScores[i]) << endl;
        cout << "Lowest score = " << min(studentScores[i]) << endl;
        double grade = mean(studentScores[i]);
        cout << "Mean = " << grade << " Grade:" << gradeLetter(grade) << endl;  // finish gradeletter function.
        cout << "Mean (lowest dropped) = " << meanLowestDropped(studentScores[i]) << endl;
        cout << "-------------------------------------" << endl;
    }

    // PRINT BLANK LINES
    cout << endl;
    cout << endl;
    cout << "++++++++++++++++++++++++++++++++++++++++++++" << endl;
    cout << endl;
    cout << endl;

    // PRINT ASSIGNMENT RESULTS
    for (int i = 0; i < assignmentScores.size(); i++) {
        cout << "Assignment: " << i + 1 << endl;
        cout << "Highest score = " << max(assignmentScores[i]) << endl;
        cout << "Lowest score = " << min(assignmentScores[i]) << endl;
        double grade = mean(assignmentScores[i]);
        cout << "Mean = " << grade << " Grade:" << gradeLetter(grade) <<  endl;  // finish gradeletter function.
        cout << "Mean (lowest dropped) = " << meanLowestDropped(assignmentScores[i]) << endl;
        cout << "-------------------------------------" << endl;
    }
}